

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleDirectiveSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  Token directive;
  SimpleDirectiveSyntax *pSVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pSVar1 = (SimpleDirectiveSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  directive.info = in_RSI;
  directive._0_8_ = in_RDX;
  slang::syntax::SimpleDirectiveSyntax::SimpleDirectiveSyntax
            ((SimpleDirectiveSyntax *)in_RDX->endPtr,(SyntaxKind)((ulong)in_RDX->head >> 0x20),
             directive);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }